

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue245(void)

{
  _Bool _Var1;
  uint32_t count;
  int32_t offset;
  int32_t runLength;
  uint32_t targetEntries;
  roaring_bitmap_t *bitmap;
  uint32_t in_stack_00000038;
  uint32_t in_stack_0000003c;
  roaring_bitmap_t *in_stack_00000040;
  uint local_18;
  
  roaring_bitmap_create();
  roaring_bitmap_add_range_closed(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  for (local_18 = 1; local_18 < 0x800; local_18 = local_18 + 1) {
    roaring_bitmap_add_range_closed(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  }
  _Var1 = check_serialization(_count);
  if (!_Var1) {
    printf("Bitmaps do not match at 2048 entries\n");
    abort();
  }
  roaring_bitmap_add_range_closed(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  _Var1 = check_serialization(_count);
  if (!_Var1) {
    printf("Bitmaps do not match at 2049 entries\n");
    abort();
  }
  roaring_bitmap_free((roaring_bitmap_t *)0x10c197);
  return;
}

Assistant:

DEFINE_TEST(issue245) {
    roaring_bitmap_t *bitmap = roaring_bitmap_create();
    const uint32_t targetEntries = 2048;
    const int32_t runLength = 8;
    int32_t offset = 0;
    // Add a single run more than 2 extents longs.
    roaring_bitmap_add_range_closed(bitmap, offset, offset + runLength);
    offset += runLength + 2;
    // Add 2047 non-contiguous bits.
    for (uint32_t count = 1; count < targetEntries; count++, offset += 2) {
        roaring_bitmap_add_range_closed(bitmap, offset, offset);
    }

    if (!check_serialization(bitmap)) {
        printf("Bitmaps do not match at 2048 entries\n");
        abort();
    }

    // Add one more, forcing it to become a bitset
    offset += 2;
    roaring_bitmap_add_range_closed(bitmap, offset, offset);

    if (!check_serialization(bitmap)) {
        printf("Bitmaps do not match at 2049 entries\n");
        abort();
    }
    roaring_bitmap_free(bitmap);
}